

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::trySymlink
          (InMemoryDirectory *this,PathPtr path,StringPtr content,WriteMode mode)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  Impl *pIVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined1 uVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  String *pSVar8;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_60 [16];
  size_t sStack_50;
  ArrayDisposer *local_48;
  Maybe<kj::_::Mutex::Waiter_&> local_40;
  _Base_ptr local_38;
  
  sVar6 = path.parts.size_;
  pSVar8 = path.parts.ptr;
  if (sVar6 == 1) {
    this_00 = &this->impl;
    local_60._0_8_ = local_60._0_8_ & 0xffffffffffffff00;
    _::Mutex::lock(&this_00->mutex,0);
    pIVar1 = &(this->impl).value;
    sVar6 = (pSVar8->content).size_;
    if (sVar6 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar8->content).ptr;
    }
    name.content.size_ = (size_t)pcVar7;
    name.content.ptr = (char *)pIVar1;
    local_40.ptr = (Waiter *)this_00;
    local_38 = (_Base_ptr)pIVar1;
    Impl::openEntry((Impl *)local_60,name,(int)sVar6 + (uint)(sVar6 == 0));
    uVar3 = local_60._0_8_;
    uVar4 = (Exception *)local_60._0_8_ != (Exception *)0x0;
    if ((bool)uVar4) {
      local_60._0_8_ = (*(code *)**(undefined8 **)pIVar1->clock)();
      heapString((String *)(local_60 + 8),content.content.ptr,content.content.size_ - 1);
      if (*(int *)(uVar3 + 0x18) != 0) {
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                   *)(uVar3 + 0x18));
      }
      *(undefined8 *)(uVar3 + 0x20) = local_60._0_8_;
      (((String *)(uVar3 + 0x28))->content).ptr = (char *)local_60._8_8_;
      (((String *)(uVar3 + 0x28))->content).size_ = sStack_50;
      (((String *)(uVar3 + 0x28))->content).disposer = local_48;
      local_60._8_8_ = (InMemoryFileFactory *)0x0;
      sStack_50 = 0;
      *(undefined4 *)(uVar3 + 0x18) = 3;
      lVar5 = (*(code *)**(undefined8 **)pIVar1->clock)();
      (this->impl).value.lastModified.value.value = lVar5;
    }
    _::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  else if (sVar6 == 0) {
    if ((mode & CREATE) == 0) {
      uVar4 = 0;
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4de,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      _::Debug::Fault::~Fault((Fault *)local_60);
    }
    else {
      uVar4 = 0;
    }
  }
  else {
    sVar2 = (pSVar8->content).size_;
    if (sVar2 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar8->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar7;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)local_60,name_00,(int)sVar2 + (uint)(sVar2 == 0));
    if ((InMemoryFileFactory *)local_60._8_8_ == (InMemoryFileFactory *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                ((Fault *)local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4ed,FAILED,(char *)0x0,"\"couldn\'t create parent directory\"",
                 (char (*) [33])"couldn\'t create parent directory");
      _::Debug::Fault::~Fault((Fault *)local_60);
      uVar4 = 0;
    }
    else {
      uVar4 = (**(code **)(*(_func_int **)local_60._8_8_ + 0x98))
                        (local_60._8_8_,pSVar8 + 1,sVar6 - 1,content.content.ptr,
                         content.content.size_,mode);
      (**(code **)(((String *)local_60._0_8_)->content).ptr)
                (local_60._0_8_,
                 (InMemoryFileFactory *)
                 (local_60._8_8_ + *(long *)(*(_func_int **)local_60._8_8_ + -0x10)));
    }
  }
  return (bool)uVar4;
}

Assistant:

bool trySymlink(PathPtr path, StringPtr content, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        entry.init(SymlinkNode { lock->clock.now(), heapString(content) });
        lock->modified();
        return true;
      } else {
        return false;
      }
    } else {
      KJ_IF_SOME(child, tryGetParent(path[0], mode)) {
        return child->trySymlink(path.slice(1, path.size()), content, mode);
      } else {
        KJ_FAIL_REQUIRE("couldn't create parent directory") { return false; }
      }